

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

string * __thiscall
rpn::FunctionRefExpression::GetFunctionResult_abi_cxx11_
          (string *__return_storage_ptr__,FunctionRefExpression *this,CommandContext *commandContext
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  CommandContext *local_20;
  CommandContext *commandContext_local;
  FunctionRefExpression *this_local;
  
  local_20 = commandContext;
  commandContext_local = (CommandContext *)this;
  this_local = (FunctionRefExpression *)__return_storage_ptr__;
  std::operator+(&local_40,"[result_of(",&commandContext->result);
  std::operator+(__return_storage_ptr__,&local_40,")]");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFunctionResult(const CommandContext& commandContext) const
    {
        return {"[result_of(" + commandContext.result + ")]"};
    }